

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O2

void __thiscall
double_conversion::BignumDtoa
          (double_conversion *this,double v,BignumDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  double dVar1;
  uint16_t uVar2;
  int iVar3;
  BignumDtoaMode BVar4;
  byte *pbVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  undefined4 in_register_00000014;
  char *pcVar9;
  ulong uVar10;
  Bignum *b;
  uint uVar11;
  int *piVar12;
  uint uVar13;
  ulong factor;
  long in_FS_OFFSET;
  bool bVar14;
  bool bVar15;
  float fVar16;
  Vector<char> buffer_00;
  int *in_stack_fffffffffffff788;
  Bignum local_848;
  Bignum local_644;
  Bignum local_440;
  Bignum local_23c;
  long local_38;
  
  pcVar9 = (char *)CONCAT44(in_register_00000014,requested_digits);
  piVar12 = buffer._8_8_;
  uVar11 = (uint)this;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (uVar11 == 1) {
    fVar16 = (float)v;
    uVar8 = (uint)fVar16 & 0x7fffff;
    bVar14 = ((uint)fVar16 & 0x7f800000) == 0;
    uVar13 = uVar8 + 0x800000;
    if (bVar14) {
      uVar13 = uVar8;
    }
    factor = (ulong)uVar13;
    iVar3 = -0x95;
    if (!bVar14) {
      iVar3 = ((uint)fVar16 >> 0x17 & 0xff) - 0x96;
    }
    bVar14 = uVar8 == 0;
    bVar15 = ((uint)fVar16 & 0x7f000000) == 0;
  }
  else {
    uVar10 = (ulong)v & 0xfffffffffffff;
    bVar14 = ((ulong)v & 0x7ff0000000000000) == 0;
    factor = uVar10 | 0x10000000000000;
    if (bVar14) {
      factor = uVar10;
    }
    iVar3 = -0x432;
    if (!bVar14) {
      iVar3 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
    }
    bVar14 = uVar10 == 0;
    bVar15 = ((ulong)v & 0x7fe0000000000000) == 0;
  }
  iVar7 = iVar3 + 0x34;
  for (uVar10 = factor; (uVar10 & 0x10000000000000) == 0; uVar10 = uVar10 * 2) {
    iVar7 = iVar7 + -1;
  }
  dVar1 = ceil((double)iVar7 * 0.30102999566398114 + -1e-10);
  uVar13 = (uint)dVar1;
  if ((uVar11 == 2) && ((int)mode < (int)~uVar13)) {
    *pcVar9 = '\0';
    *piVar12 = 0;
    *length = -mode;
    goto LAB_003953ed;
  }
  memset(local_23c.bigits_buffer_,0xaa,0x200);
  local_23c.used_bigits_ = 0;
  local_23c.exponent_ = 0;
  memset(local_440.bigits_buffer_,0xaa,0x200);
  local_440.used_bigits_ = 0;
  local_440.exponent_ = 0;
  memset(local_644.bigits_buffer_,0xaa,0x200);
  local_644.used_bigits_ = 0;
  local_644.exponent_ = 0;
  memset(local_848.bigits_buffer_,0xaa,0x200);
  local_848.used_bigits_ = 0;
  local_848.exponent_ = 0;
  if (iVar3 < 0) {
    if ((int)uVar13 < 0) {
      Bignum::AssignPowerUInt16(&local_23c,10,-uVar13);
      if (uVar11 < 2) {
        Bignum::AssignBignum(&local_848,&local_23c);
        Bignum::AssignBignum(&local_644,&local_23c);
        Bignum::MultiplyByUInt64(&local_23c,factor);
        iVar7 = 1;
        Bignum::AssignUInt16(&local_440,1);
        Bignum::ShiftLeft(&local_440,-iVar3);
        Bignum::ShiftLeft(&local_23c,1);
      }
      else {
        Bignum::MultiplyByUInt64(&local_23c,factor);
        Bignum::AssignUInt16(&local_440,1);
        iVar7 = -iVar3;
      }
      Bignum::ShiftLeft(&local_440,iVar7);
    }
    else {
      Bignum::AssignUInt64(&local_23c,factor);
      Bignum::AssignPowerUInt16(&local_440,10,uVar13);
      Bignum::ShiftLeft(&local_440,-iVar3);
      if (1 < uVar11) goto LAB_0039517a;
      Bignum::ShiftLeft(&local_440,1);
      Bignum::ShiftLeft(&local_23c,1);
      Bignum::AssignUInt16(&local_848,1);
      Bignum::AssignUInt16(&local_644,1);
    }
LAB_0039513d:
    if (!(bool)(!bVar15 & bVar14 ^ 1U | 1 < uVar11)) {
      Bignum::ShiftLeft(&local_440,1);
      Bignum::ShiftLeft(&local_23c,1);
      Bignum::ShiftLeft(&local_848,1);
    }
  }
  else {
    Bignum::AssignUInt64(&local_23c,factor);
    Bignum::ShiftLeft(&local_23c,iVar3);
    Bignum::AssignPowerUInt16(&local_440,10,uVar13);
    if (uVar11 < 2) {
      Bignum::ShiftLeft(&local_440,1);
      Bignum::ShiftLeft(&local_23c,1);
      Bignum::AssignUInt16(&local_848,1);
      Bignum::ShiftLeft(&local_848,iVar3);
      Bignum::AssignUInt16(&local_644,1);
      Bignum::ShiftLeft(&local_644,iVar3);
      goto LAB_0039513d;
    }
  }
LAB_0039517a:
  iVar3 = Bignum::PlusCompare(&local_23c,&local_848,&local_440);
  if ((factor & 1) == 0) {
    if (-1 < iVar3) goto LAB_003951f4;
LAB_003951a3:
    *length = uVar13;
    Bignum::Times10(&local_23c);
    bVar14 = Bignum::Equal(&local_644,&local_848);
    Bignum::Times10(&local_644);
    if (bVar14) {
      Bignum::AssignBignum(&local_848,&local_644);
    }
    else {
      Bignum::Times10(&local_848);
    }
  }
  else {
    if (iVar3 < 1) goto LAB_003951a3;
LAB_003951f4:
    *length = uVar13 + 1;
  }
  if (uVar11 < 2) {
    bVar14 = Bignum::Equal(&local_644,&local_848);
    b = &local_848;
    if (bVar14) {
      b = &local_644;
    }
    *piVar12 = 0;
    while( true ) {
      uVar2 = Bignum::DivideModuloIntBignum(&local_23c,&local_440);
      iVar3 = *piVar12;
      *piVar12 = iVar3 + 1;
      pcVar9[iVar3] = (char)uVar2 + '0';
      if ((factor & 1) == 0) {
        bVar15 = Bignum::LessEqual(&local_23c,&local_644);
        iVar3 = -1;
      }
      else {
        bVar15 = Bignum::Less(&local_23c,&local_644);
        iVar3 = 0;
      }
      iVar7 = Bignum::PlusCompare(&local_23c,b,&local_440);
      if ((bVar15 != false) || (iVar3 < iVar7)) break;
      Bignum::Times10(&local_23c);
      Bignum::Times10(&local_644);
      if (!bVar14) {
        Bignum::Times10(&local_848);
      }
    }
    if (bVar15 == true && iVar3 < iVar7) {
      iVar3 = Bignum::PlusCompare(&local_23c,&local_23c,&local_440);
      if (-1 < iVar3) {
        pbVar5 = (byte *)(pcVar9 + (long)*piVar12 + -1);
        bVar6 = *pbVar5;
        if ((iVar3 != 0) || ((bVar6 & 1) != 0)) goto LAB_00395377;
      }
    }
    else if (bVar15 == false) {
      pbVar5 = (byte *)(pcVar9 + (long)*piVar12 + -1);
      bVar6 = *pbVar5;
LAB_00395377:
      *pbVar5 = bVar6 + 1;
    }
  }
  else if (uVar11 == 2) {
    BVar4 = -*length;
    if ((int)mode < (int)BVar4) {
      *length = -mode;
    }
    else {
      if (BVar4 != mode) {
        mode = *length + mode;
        goto LAB_00395230;
      }
      Bignum::Times10(&local_440);
      iVar3 = Bignum::PlusCompare(&local_23c,&local_23c,&local_440);
      if (-1 < iVar3) {
        *pcVar9 = '1';
        *piVar12 = 1;
        *length = *length + 1;
        goto LAB_003953dc;
      }
    }
    *piVar12 = 0;
  }
  else {
    if (uVar11 != 3) {
      abort();
    }
LAB_00395230:
    buffer_00._8_8_ = piVar12;
    buffer_00.start_ = pcVar9;
    GenerateCountedDigits(mode,length,&local_23c,&local_440,buffer_00,in_stack_fffffffffffff788);
  }
LAB_003953dc:
  pcVar9[*piVar12] = '\0';
LAB_003953ed:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    DOUBLE_CONVERSION_ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  DOUBLE_CONVERSION_ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  buffer[*length] = '\0';
}